

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

Mat3x3d * __thiscall
OpenMD::Stats::getMatrixAverage(Mat3x3d *__return_storage_ptr__,Stats *this,int index)

{
  long lVar1;
  double (*padVar2) [3];
  uint i;
  double (*padVar3) [3];
  long lVar4;
  
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [2] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [0] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
  [1] = 0.0;
  (__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
  [2] = 0.0;
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo);
  padVar2 = (double (*) [3])(lVar1 + 0x58);
  if ((Mat3x3d *)padVar2 != __return_storage_ptr__) {
    lVar1 = 0;
    padVar3 = (double (*) [3])__return_storage_ptr__;
    do {
      lVar4 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar4] =
             (((SquareMatrix<double,_3> *)*padVar2)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar1 = lVar1 + 1;
      padVar3 = padVar3 + 1;
      padVar2 = padVar2 + 1;
    } while (lVar1 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Stats::getMatrixAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    Mat3x3d value;
    dynamic_cast<MatrixAccumulator*>(data_[index].accumulator)
        ->getAverage(value);
    return value;
  }